

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSTFile.cpp
# Opt level: O3

string * read_string_abi_cxx11_(string *__return_storage_ptr__,char **p,int size)

{
  char *pcVar1;
  
  pcVar1 = *p;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + size);
  *p = *p + size;
  return __return_storage_ptr__;
}

Assistant:

std::string read_string(char *&p, int size) {
	std::string s(p, size);
	p += size;
	return s;
}